

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

void __thiscall FileReaderZ::FileReaderZ(FileReaderZ *this,FileReader *file,bool zip)

{
  uInt uVar1;
  int iVar2;
  undefined4 extraout_var;
  FString local_20;
  
  (this->super_FileReaderBase)._vptr_FileReaderBase = (_func_int **)&PTR__FileReaderZ_006f4fa0;
  this->File = file;
  this->SawEOF = false;
  uVar1 = (*(file->super_FileReaderBase)._vptr_FileReaderBase[2])(file,this->InBuff,0x1000);
  if (CONCAT44(extraout_var,uVar1) < 0x1000) {
    this->SawEOF = true;
  }
  (this->Stream).next_in = this->InBuff;
  (this->Stream).avail_in = uVar1;
  (this->Stream).zalloc = (alloc_func)0x0;
  (this->Stream).zfree = (free_func)0x0;
  if (zip) {
    iVar2 = inflateInit2_(&this->Stream,0xfffffff1,"1.2.11",0x70);
  }
  else {
    iVar2 = inflateInit_(&this->Stream,"1.2.11",0x70);
  }
  if (iVar2 != 0) {
    M_ZLibError((int)&local_20);
    I_Error("FileReaderZ: inflateInit failed: %s\n",local_20.Chars);
    FString::~FString(&local_20);
  }
  return;
}

Assistant:

FileReaderZ::FileReaderZ (FileReader &file, bool zip)
: File(file), SawEOF(false)
{
	int err;

	FillBuffer ();

	Stream.zalloc = Z_NULL;
	Stream.zfree = Z_NULL;

	if (!zip) err = inflateInit (&Stream);
	else err = inflateInit2 (&Stream, -MAX_WBITS);

	if (err != Z_OK)
	{
		I_Error ("FileReaderZ: inflateInit failed: %s\n", M_ZLibError(err).GetChars());
	}
}